

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

object * objectRead(FILE *fp)

{
  uint uVar1;
  int iVar2;
  object *poVar3;
  object *poVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint local_34;
  
  uVar1 = fgetc((FILE *)fp);
  get_byte_offset = get_byte_offset + 1;
  if (uVar1 == 0xffffffff) {
    error_impl("readTag",0x2c0,"Unexpected EOF reading image file: reading tag byte.");
    uVar8 = 0xf;
    local_34 = 0xe0;
LAB_00104640:
    error_impl("readTag",0x2d2,
               "readTag(): Error reading image file: tag value field exceeds machine word size.  Image created on another machine? Field size=%d"
               ,(ulong)uVar8);
  }
  else {
    local_34 = uVar1 & 0xe0;
    uVar8 = uVar1 & 0xf;
    if ((uVar1 & 0x10) == 0) goto LAB_001046b1;
    if (8 < uVar8) {
      local_34 = uVar1 & 0xe0;
      goto LAB_00104640;
    }
    if (uVar8 == 0) {
      uVar8 = 0;
      goto LAB_001046b1;
    }
    local_34 = uVar1 & 0xe0;
  }
  bVar7 = 0;
  uVar9 = 0;
  uVar1 = uVar8;
  do {
    uVar8 = fgetc((FILE *)fp);
    get_byte_offset = get_byte_offset + 1;
    if (uVar8 == 0xffffffff) {
      error_impl("readTag",0x2d9,"readTag(): Unexpected EOF reading image file!");
    }
    uVar8 = uVar9 | (uVar8 & 0xff) << (bVar7 & 0x1f);
    bVar7 = bVar7 + 8;
    uVar1 = uVar1 - 1;
    uVar9 = uVar8;
  } while (uVar1 != 0);
LAB_001046b1:
  switch(local_34 >> 5) {
  case 0:
    poVar3 = (object *)0x0;
    error_impl("objectRead",0x26b,"objectRead(): Read in a NULL object!");
    break;
  case 1:
    poVar3 = (object *)((long)&memoryPointer->header + (long)(int)(uVar8 * -8 + -0x10));
    memoryPointer = poVar3;
    if ((long)poVar3 < (long)memoryBase) {
      poVar3 = gcollect(uVar8);
    }
    else {
      poVar3->header = (ulong)(uVar8 * 4);
    }
    lVar5 = (long)indirtop;
    indirtop = indirtop + 1;
    indirArray[lVar5] = poVar3;
    poVar4 = objectRead(fp);
    poVar3->class = poVar4;
    if (0 < (int)uVar8) {
      uVar6 = 0;
      do {
        poVar4 = objectRead(fp);
        (&poVar3[1].header)[uVar6] = (uintptr_t)poVar4;
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    break;
  case 3:
    uVar8 = -uVar8;
  case 2:
    poVar3 = (object *)((long)(int)uVar8 * 2 + 1);
    break;
  case 4:
    poVar3 = gcialloc(uVar8);
    lVar5 = (long)indirtop;
    indirtop = indirtop + 1;
    indirArray[lVar5] = poVar3;
    if (0 < (int)uVar8) {
      uVar6 = 0;
      do {
        iVar2 = fgetc((FILE *)fp);
        get_byte_offset = get_byte_offset + 1;
        *(char *)((long)&poVar3[1].header + uVar6) = (char)iVar2;
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    poVar4 = objectRead(fp);
    poVar3->class = poVar4;
    break;
  case 5:
    if (indirtop < (int)uVar8) {
      error_impl("objectRead",0x294,"Illegal previous object index %d (max %d)!",(ulong)uVar8);
    }
    poVar3 = indirArray[(int)uVar8];
    break;
  case 6:
    poVar3 = *indirArray;
    break;
  default:
    poVar3 = (object *)0x0;
    error_impl("objectRead",0x2a0,"Illegal tag type %d!");
  }
  return poVar3;
}

Assistant:

struct object *objectRead(FILE *fp)
{
    int type;
    int size;
    int val;
    int i;
    struct object *newObj=(struct object *)0;
    struct byteObject *bnewObj;

    /* get the tag header for the object, this has a type and value */
    readTag(fp,&type,&val);

    switch(type) {
    case LST_ERROR_TYPE:    /* nil obj */
        error("objectRead(): Read in a NULL object!");

        break;

    case LST_OBJ_TYPE:  /* ordinary object */
        size = val;
        newObj = gcalloc(size);
        indirArray[indirtop++] = newObj;
        newObj->class = objectRead(fp);

        /* get object field values. */
        for (i = 0; i < size; i++) {
            newObj->data[i] = objectRead(fp);
        }

        break;

    case LST_PINT_TYPE: /* positive integer */
        newObj = newInteger(val);
        break;

    case LST_NINT_TYPE: /* negative integer */
        newObj = newInteger(-val);
        break;

    case LST_BARRAY_TYPE:   /* byte arrays */
        size = val;
//        newObj = staticIAllocate(size);
        newObj = gcialloc(size);
        indirArray[indirtop++] = newObj;
        bnewObj = (struct byteObject *) newObj;
        for (i = 0; i < size; i++) {
            /* FIXME check for EOF! */
            bnewObj->bytes[i] = (uint8_t)get_byte(fp);
        }

        bnewObj->class = objectRead(fp);
        break;

    case LST_POBJ_TYPE: /* previous object */
        if(val>indirtop) {
            error("Illegal previous object index %d (max %d)!",val, indirtop);
        }

        newObj = indirArray[val];

        break;

    case LST_NIL_TYPE:  /* object 0 (nil object) */
        newObj = indirArray[0];
        break;

    default:
        error("Illegal tag type %d!",type);
        break;
    }

    return newObj;
}